

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Content.cpp
# Opt level: O2

CharacterSet __thiscall ZXing::Content::guessEncoding(Content *this)

{
  ulong uVar1;
  pointer pEVar2;
  CharacterSet CVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  anon_class_16_2_f1cc56cb local_48;
  ByteArray input;
  
  local_48.input = &input;
  input.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  input.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pEVar2 = (this->encodings).
           super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_48.this = this;
  if (pEVar2 == (this->encodings).
                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    iVar5 = *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
            *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
  }
  else {
    iVar5 = pEVar2->pos;
    if (iVar5 == 0) goto LAB_0014ec94;
  }
  guessEncoding::anon_class_16_2_f1cc56cb::operator()
            (&local_48,(uint)this->hasECI + Unknown | ISO8859_1,0,iVar5);
LAB_0014ec94:
  uVar1 = 0;
  while( true ) {
    uVar4 = uVar1;
    pEVar2 = (this->encodings).
             super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (ulong)((long)(this->encodings).
                          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2) >> 3;
    if ((long)(int)uVar6 <= (long)uVar4) break;
    uVar1 = uVar4 + 1;
    if (uVar1 == (uVar6 & 0xffffffff)) {
      iVar5 = *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
              *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
    }
    else {
      iVar5 = pEVar2[uVar4 + 1].pos;
    }
    if (pEVar2[uVar4].pos != iVar5) {
      guessEncoding::anon_class_16_2_f1cc56cb::operator()
                (&local_48,pEVar2[uVar4].eci,pEVar2[uVar4].pos,iVar5);
    }
  }
  if (input.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      input.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    CVar3 = Unknown;
  }
  else {
    CVar3 = TextDecoder::GuessEncoding
                      (input.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (long)input.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)input.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,ISO8859_1);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&input);
  return CVar3;
}

Assistant:

CharacterSet Content::guessEncoding() const
{
	// assemble all blocks with unknown encoding
	ByteArray input;
	ForEachECIBlock([&](ECI eci, int begin, int end) {
		if (eci == ECI::Unknown)
			input.insert(input.end(), bytes.begin() + begin, bytes.begin() + end);
	});

	if (input.empty())
		return CharacterSet::Unknown;

	return TextDecoder::GuessEncoding(input.data(), input.size(), CharacterSet::ISO8859_1);
}